

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O1

apx_error_t
apx_dataElement_derive_types_on_element
          (apx_dataElement_t *self,adt_ary_t *type_list,adt_hash_t *type_map)

{
  apx_typeCode_t aVar1;
  apx_typeId_t s32Index;
  int iVar2;
  int32_t iVar3;
  apx_error_t aVar4;
  apx_error_t aVar5;
  apx_dataType_t *paVar6;
  void **ppvVar7;
  apx_dataElement_t *self_00;
  int s32Index_00;
  bool bVar8;
  bool bVar9;
  
  aVar4 = 1;
  if (type_map == (adt_hash_t *)0x0 ||
      (type_list == (adt_ary_t *)0x0 || self == (apx_dataElement_t *)0x0)) {
    return 1;
  }
  aVar1 = self->type_code;
  if (aVar1 == '\x11') {
    paVar6 = (apx_dataType_t *)adt_hash_value(type_map,(self->type_ref).name);
    if (paVar6 != (apx_dataType_t *)0x0) {
      aVar5 = apx_dataType_derive_types_on_element(paVar6,type_list,type_map);
      bVar8 = aVar5 == 0;
      if (bVar8) {
        apx_dataElement_set_type_ref_ptr(self,paVar6);
        bVar8 = true;
      }
      goto LAB_00127993;
    }
    aVar4 = 0x10;
  }
  else {
    if (aVar1 != '\x10') {
      if (aVar1 != '\x0f') {
        return 0;
      }
      if (self->elements == (adt_ary_t *)0x0) {
        iVar2 = -1;
      }
      else {
        iVar2 = adt_ary_length(self->elements);
      }
      bVar8 = 0 < iVar2;
      if (0 < iVar2) {
        s32Index_00 = 0;
        do {
          if ((self->elements == (adt_ary_t *)0x0) ||
             (ppvVar7 = adt_ary_get(self->elements,s32Index_00), ppvVar7 == (void **)0x0)) {
            self_00 = (apx_dataElement_t *)0x0;
          }
          else {
            self_00 = (apx_dataElement_t *)*ppvVar7;
          }
          if (self_00 == (apx_dataElement_t *)0x0) {
            bVar9 = false;
            aVar4 = 0x24;
          }
          else {
            aVar5 = apx_dataElement_derive_types_on_element(self_00,type_list,type_map);
            bVar9 = aVar5 == 0;
            if (!bVar9) {
              aVar4 = aVar5;
            }
          }
          if (!bVar9) break;
          s32Index_00 = s32Index_00 + 1;
          bVar8 = s32Index_00 < iVar2;
        } while (s32Index_00 != iVar2);
      }
      if (!bVar8) {
        return 0;
      }
      return aVar4;
    }
    s32Index = (self->type_ref).id;
    aVar5 = 0x10;
    aVar4 = aVar5;
    if ((-1 < (int)s32Index) && (iVar3 = adt_ary_length(type_list), (int)s32Index <= iVar3)) {
      paVar6 = (apx_dataType_t *)adt_ary_value(type_list,s32Index);
      if (paVar6 == (apx_dataType_t *)0x0) {
        aVar4 = 0x24;
      }
      else {
        aVar4 = apx_dataType_derive_types_on_element(paVar6,type_list,type_map);
        if (aVar4 == 0) {
          apx_dataElement_set_type_ref_ptr(self,paVar6);
          bVar8 = true;
          goto LAB_00127993;
        }
      }
    }
  }
  bVar8 = false;
  aVar5 = aVar4;
LAB_00127993:
  if (bVar8) {
    return 0;
  }
  return aVar5;
}

Assistant:

apx_error_t apx_dataElement_derive_types_on_element(apx_dataElement_t* self, adt_ary_t const* type_list, adt_hash_t const* type_map)
{
   if ( (self != NULL) && (type_list != NULL) && (type_map != NULL) )
   {
      apx_typeCode_t const type_code = self->type_code;
      if (type_code == APX_TYPE_CODE_RECORD)
      {
         apx_error_t result = APX_NO_ERROR;
         int32_t i;
         int32_t num_elements = apx_dataElement_get_num_child_elements(self);
         for (i = 0; i < num_elements; i++)
         {
            apx_dataElement_t* child_element = apx_dataElement_get_child_at(self, i);            
            if (child_element == NULL)
            {
               return APX_NULL_PTR_ERROR;
            }
            result = apx_dataElement_derive_types_on_element(child_element, type_list, type_map);            
            if (result != APX_NO_ERROR)
            {
               return result;
            }
         }
      }
      else if (type_code == APX_TYPE_CODE_REF_ID)
      {
         apx_dataType_t* data_type = NULL;
         apx_error_t result = APX_NO_ERROR;
         int32_t type_index = (int32_t) apx_dataElement_get_type_ref_id(self);         
         if ((type_index < 0) || (type_index > adt_ary_length(type_list)))
         {
            return APX_INVALID_TYPE_REF_ERROR;
         }
         data_type = adt_ary_value(type_list, type_index);
         if (data_type == NULL)
         {
            return APX_NULL_PTR_ERROR;
         }
         result = apx_dataType_derive_types_on_element(data_type, type_list, type_map);
         if (result != APX_NO_ERROR)
         {
            return result;
         }
         apx_dataElement_set_type_ref_ptr(self, (void*) data_type);
      }
      else if (type_code == APX_TYPE_CODE_REF_NAME)
      {
         apx_dataType_t* data_type = NULL;         
         char const* type_name = apx_dataElement_get_type_ref_name(self);
         data_type = (apx_dataType_t*)adt_hash_value(type_map, type_name);         
         if (data_type != NULL)
         {            
            apx_error_t result = apx_dataType_derive_types_on_element(data_type, type_list, type_map);            
            if (result != APX_NO_ERROR)
            {
               return result;
            }
            apx_dataElement_set_type_ref_ptr(self, (void*)data_type);
         }
         else
         {
            return APX_INVALID_TYPE_REF_ERROR;
         }
      }
      else
      {
         //Type already derived
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}